

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::add_segment(CTcEmbedBuilderSgl *this,CTcPrsNode *cur)

{
  CTcPrsNode *pCVar1;
  _func_int **pp_Var2;
  CTcToken *tok;
  CTcConstVal cval;
  
  if ((G_tok->curtok_).text_len_ != 0) {
    tok = &G_tok->curtok_;
    cval.typ_ = TC_CVT_UNK;
    cval._32_1_ = 0;
    CTcConstVal::set_sstr(&cval,tok);
    pCVar1 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)tok);
    pp_Var2 = (_func_int **)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)tok);
    *(undefined1 *)(pp_Var2 + 5) = cval._32_1_;
    pp_Var2[3] = (_func_int *)cval.val_.floatval_.len_;
    pp_Var2[4] = (_func_int *)cval.val_._16_8_;
    pp_Var2[1] = (_func_int *)CONCAT44(cval._4_4_,cval.typ_);
    pp_Var2[2] = (_func_int *)cval.val_.intval_;
    *pp_Var2 = (_func_int *)&PTR_gen_code_003505b8;
    pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cur;
    pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
    (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00352170;
    cur = pCVar1;
  }
  return cur;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {        
        /* 
         *   Add the next string segment.  We can omit it if it's zero
         *   length, as this will add nothing to the result.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            CTcConstVal cval;
            cval.set_sstr(G_tok->getcur());
            cur = new CTPNAdd(cur, new CTPNConst(&cval));
        }
        
        /* return the new combined node */
        return cur;
    }